

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O3

optional<pbrt::SquareMatrix<3>_> *
pbrt::LinearLeastSquares
          (optional<pbrt::SquareMatrix<3>_> *__return_storage_ptr__,Float (*A) [3],Float (*B) [3],
          int rows)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  Float FVar5;
  Float FVar6;
  Float FVar7;
  int i;
  Float *pFVar8;
  Float (*paFVar9) [3];
  undefined8 *puVar10;
  Float (*paFVar11) [3];
  long lVar12;
  Float *pFVar13;
  Float (*paFVar14) [3];
  int k;
  Float *pFVar15;
  int j;
  long lVar16;
  long lVar17;
  long lVar18;
  optional<pbrt::SquareMatrix<3>_> *__return_storage_ptr___00;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  SquareMatrix<3> AtA;
  SquareMatrix<3> r_1;
  SquareMatrix<3> AtB;
  SquareMatrix<3> r;
  optional<pbrt::SquareMatrix<3>_> AtAi;
  SquareMatrix<3> local_f8;
  Float local_cc [2];
  undefined8 uStack_c4;
  undefined8 uStack_bc;
  undefined8 uStack_b4;
  undefined4 local_ac;
  undefined1 local_a8 [32];
  undefined4 local_88;
  SquareMatrix<3> local_7c;
  optional<pbrt::SquareMatrix<3>_> local_58;
  
  SquareMatrix<3>::SquareMatrix(&local_f8);
  lVar18 = 0;
  local_f8.m[2][2] = 0.0;
  local_f8.m[0][0] = 0.0;
  local_f8.m[0][1] = 0.0;
  local_f8.m[0][2] = 0.0;
  local_f8.m[1][0] = 0.0;
  local_f8.m[1][1] = 0.0;
  local_f8.m[1][2] = 0.0;
  local_f8.m[2][0] = 0.0;
  local_f8.m[2][1] = 0.0;
  SquareMatrix<3>::SquareMatrix((SquareMatrix<3> *)local_a8);
  local_88 = 0;
  local_a8 = ZEXT1632(ZEXT816(0) << 0x40);
  pFVar8 = *A;
  do {
    lVar16 = 0;
    lVar12 = lVar18 * 0xc + -0xa8;
    pFVar13 = *B;
    pFVar15 = *A;
    do {
      if (0 < rows) {
        auVar24 = ZEXT464((uint)local_f8.m[lVar18][lVar16]);
        auVar23 = ZEXT464(*(uint *)(local_a8 + lVar16 * 4 + lVar12 + 0xa8));
        lVar17 = 0;
        do {
          auVar20 = vfmadd231ss_fma(auVar24._0_16_,ZEXT416(*(uint *)((long)pFVar8 + lVar17)),
                                    ZEXT416(*(uint *)((long)pFVar15 + lVar17)));
          auVar24 = ZEXT1664(auVar20);
          auVar4 = vfmadd231ss_fma(auVar23._0_16_,ZEXT416(*(uint *)((long)pFVar8 + lVar17)),
                                   ZEXT416(*(uint *)((long)pFVar13 + lVar17)));
          auVar23 = ZEXT1664(auVar4);
          lVar17 = lVar17 + 0xc;
        } while ((ulong)(uint)rows * 0xc != lVar17);
        local_f8.m[lVar18][lVar16] = auVar20._0_4_;
        *(int *)(local_a8 + lVar16 * 4 + lVar12 + 0xa8) = auVar4._0_4_;
      }
      lVar16 = lVar16 + 1;
      pFVar15 = pFVar15 + 1;
      pFVar13 = pFVar13 + 1;
    } while (lVar16 != 3);
    lVar18 = lVar18 + 1;
    pFVar8 = pFVar8 + 1;
  } while (lVar18 != 3);
  __return_storage_ptr___00 = &local_58;
  Inverse<3>(__return_storage_ptr___00,&local_f8);
  if (local_58.set == false) {
    local_cc[0] = 0.0;
    local_cc[1] = 0.0;
    uStack_c4 = 0;
    uStack_bc = 0;
    uStack_b4 = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  }
  else {
    SquareMatrix<3>::SquareMatrix(&local_7c);
    lVar18 = 0;
    do {
      lVar12 = 0;
      paFVar9 = local_7c.m + lVar18;
      paFVar11 = (Float (*) [3])local_a8;
      do {
        auVar20 = ZEXT816(0) << 0x40;
        lVar16 = 0;
        paFVar14 = paFVar11;
        do {
          lVar17 = lVar16 * 4;
          lVar16 = lVar16 + 1;
          auVar20 = vfmadd231ss_fma(auVar20,ZEXT416(*(uint *)((long)&__return_storage_ptr___00->
                                                                     optionalValue + lVar17)),
                                    ZEXT416((uint)(*(Float (*) [3])*paFVar14)[0]));
          paFVar14 = paFVar14 + 1;
        } while (lVar16 != 3);
        (*paFVar9)[lVar12] = auVar20._0_4_;
        lVar12 = lVar12 + 1;
        paFVar11 = (Float (*) [3])(*paFVar11 + 1);
      } while (lVar12 != 3);
      lVar18 = lVar18 + 1;
      __return_storage_ptr___00 =
           (optional<pbrt::SquareMatrix<3>_> *)
           ((long)&__return_storage_ptr___00->optionalValue + 0xc);
    } while (lVar18 != 3);
    paFVar11 = (Float (*) [3])local_cc;
    SquareMatrix<3>::SquareMatrix((SquareMatrix<3> *)paFVar11);
    auVar21 = vpbroadcastq_avx512vl();
    auVar21 = vpaddq_avx2(auVar21,_DAT_004ae180);
    puVar10 = (undefined8 *)CONCAT71((int7)((ulong)paFVar9 >> 8),7);
    lVar18 = 0;
    uVar19 = (ulong)puVar10 & 0xffffffff;
    do {
      auVar22 = vpbroadcastq_avx512vl();
      lVar18 = lVar18 + 1;
      auVar22 = vpsllq_avx2(auVar22,2);
      vpaddq_avx2(auVar21,auVar22);
      auVar20 = vgatherqps_avx512vl(*puVar10);
      lVar12 = (ulong)((byte)uVar19 & 1) * auVar20._0_8_;
      FVar5 = (*(Float (*) [3])*paFVar11)[1];
      FVar6 = (*(Float (*) [3])*paFVar11)[2];
      FVar7 = paFVar11[1][0];
      bVar1 = (bool)((byte)uVar19 & 1);
      bVar2 = (bool)((byte)(uVar19 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar19 >> 2) & 1);
      (*(Float (*) [3])*paFVar11)[0] =
           (Float)((uint)bVar1 * (int)lVar12 | (uint)!bVar1 * (int)(*(Float (*) [3])*paFVar11)[0]);
      (*(Float (*) [3])*paFVar11)[1] =
           (Float)((uint)bVar2 * (int)((ulong)lVar12 >> 0x20) | (uint)!bVar2 * (int)FVar5);
      (*(Float (*) [3])*paFVar11)[2] =
           (Float)((uint)bVar3 * (uint)((byte)(uVar19 >> 1) & 1) * auVar20._8_4_ |
                  (uint)!bVar3 * (int)FVar6);
      paFVar11[1][0] = FVar7;
      paFVar11 = paFVar11 + 1;
    } while (lVar18 != 3);
    __return_storage_ptr__->set = true;
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = local_ac;
  }
  *(Float (*) [2])&__return_storage_ptr__->optionalValue = local_cc;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = uStack_c4;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uStack_bc;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = uStack_b4;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<SquareMatrix<3>> LinearLeastSquares(const Float A[][3], const Float B[][3],
                                                   int rows) {
    SquareMatrix<3> AtA = SquareMatrix<3>::Zero();
    SquareMatrix<3> AtB = SquareMatrix<3>::Zero();

    for (int i = 0; i < 3; ++i)
        for (int j = 0; j < 3; ++j)
            for (int r = 0; r < rows; ++r) {
                AtA[i][j] += A[r][i] * A[r][j];
                AtB[i][j] += A[r][i] * B[r][j];
            }

    auto AtAi = Inverse(AtA);
    if (!AtAi)
        return {};
    return Transpose(*AtAi * AtB);
}